

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

bool __thiscall Parser::LabelExists(Parser *this,IdentPtr pid,LabelId *pLabelIdList)

{
  long *plVar1;
  StmtNest *pStmt;
  long *plVar2;
  long *plVar3;
  long local_20;
  StmtNest dummy;
  
  plVar3 = &local_20;
  dummy.field_0 = (anon_union_8_2_ecfd7102_for_StmtNest_0)pLabelIdList;
  dummy.pLabelId = (LabelId *)this->m_pstmtCur;
  plVar2 = plVar3;
  do {
    while (plVar1 = (long *)plVar3[1], plVar1 == (long *)0x0) {
      plVar3 = (long *)plVar2[2];
      plVar2 = plVar3;
      if (plVar3 == (long *)0x0) goto LAB_00e6d1eb;
    }
    plVar3 = plVar1;
  } while ((IdentPtr)*plVar1 != pid);
LAB_00e6d1eb:
  return plVar1 != (long *)0x0;
}

Assistant:

bool Parser::LabelExists(IdentPtr pid, LabelId* pLabelIdList)
{
    StmtNest dummy;
    dummy.pLabelId = pLabelIdList;
    dummy.pstmtOuter = m_pstmtCur;

    // Look through each label list for the current stack of statements
    for (StmtNest* pStmt = &dummy; pStmt != nullptr; pStmt = pStmt->pstmtOuter)
    {
        for (LabelId* pLabelId = pStmt->pLabelId; pLabelId != nullptr; pLabelId = pLabelId->next)
        {
            if (pLabelId->pid == pid)
                return true;
        }
    }

    return false;
}